

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestIgnoreIndentedComments::Run(ParserTestIgnoreIndentedComments *this)

{
  BindingEnv *this_00;
  int iVar1;
  Edge *this_01;
  Test *pTVar2;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  Node *pNVar5;
  StringPiece path;
  allocator<char> local_49;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "  #indented comment\nrule cat\n  command = cat $in > $out\n  #generator = 1\n  restat = 1 # comment\n  #comment\nbuild result: cat in_1.cc in-2.O\n  #comment\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    this_00 = &(this->super_ParserTest).state.bindings_;
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_00);
    bVar3 = testing::Test::Check
                      (pTVar2,(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x56,"2u == state.bindings_.GetRules().size()");
    if (bVar3) {
      pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_00);
      pTVar2 = g_current_test;
      bVar3 = std::operator==("cat",*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                          _M_left + 2));
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x58,"\"cat\" == rule->name()");
      path.len_ = 6;
      path.str_ = "result";
      pNVar5 = State::GetNode(&(this->super_ParserTest).state,path,0);
      pTVar2 = g_current_test;
      this_01 = pNVar5->in_edge_;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"restat",&local_49);
      bVar3 = Edge::GetBindingBool(this_01,&local_48);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x5a,"edge->GetBindingBool(\"restat\")");
      std::__cxx11::string::~string((string *)&local_48);
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"generator",&local_49);
      bVar3 = Edge::GetBindingBool(this_01,&local_48);
      testing::Test::Check
                (pTVar2,!bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x5b,"edge->GetBindingBool(\"generator\")");
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, IgnoreIndentedComments) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"  #indented comment\n"
"rule cat\n"
"  command = cat $in > $out\n"
"  #generator = 1\n"
"  restat = 1 # comment\n"
"  #comment\n"
"build result: cat in_1.cc in-2.O\n"
"  #comment\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat", rule->name());
  Edge* edge = state.GetNode("result", 0)->in_edge();
  EXPECT_TRUE(edge->GetBindingBool("restat"));
  EXPECT_FALSE(edge->GetBindingBool("generator"));
}